

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O2

int64_t hdr_add(hdr_histogram *h,hdr_histogram *from)

{
  char cVar1;
  _Bool _Var2;
  int64_t iVar3;
  long lVar4;
  hdr_histogram *local_a0;
  undefined4 local_98;
  int64_t local_90;
  int64_t local_88;
  undefined8 uStack_80;
  int64_t local_78;
  undefined8 uStack_70;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  code *local_28;
  
  local_98 = 0xffffffff;
  local_90 = from->total_count;
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_48 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_28 = recorded_iter_next;
  lVar4 = 0;
  local_a0 = from;
  while( true ) {
    cVar1 = (*local_28)(&local_a0);
    iVar3 = local_88;
    if (cVar1 == '\0') break;
    _Var2 = hdr_record_values(h,local_78,local_88);
    if (_Var2) {
      iVar3 = 0;
    }
    lVar4 = lVar4 + iVar3;
  }
  return lVar4;
}

Assistant:

int64_t hdr_add(struct hdr_histogram* h, const struct hdr_histogram* from)
{
    struct hdr_iter iter;
    int64_t dropped = 0;
    hdr_iter_recorded_init(&iter, from);

    while (hdr_iter_next(&iter))
    {
        int64_t value = iter.value;
        int64_t count = iter.count;

        if (!hdr_record_values(h, value, count))
        {
            dropped += count;
        }
    }

    return dropped;
}